

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O2

Result * __thiscall
GeneticAlgorithm::operator()
          (Result *__return_storage_ptr__,GeneticAlgorithm *this,shared_ptr<Instance> *instance)

{
  element_type *peVar1;
  __normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_> __first;
  __normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_> __last;
  Individual *pIVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Domomod[P]PCmax_SourceCode_Algorithms_GeneticAlgorithm_cpp:20:53)>
  __comp;
  GeneticAlgorithm *pGVar4;
  Result *pRVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  reference pvVar9;
  Individual *pIVar10;
  string *this_00;
  size_type __n;
  __normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_> __i;
  __normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_> __last_00;
  int i;
  size_type sVar11;
  size_type __n_00;
  vector<Individual,_std::allocator<Individual>_> *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Domomod[P]PCmax_SourceCode_Algorithms_GeneticAlgorithm_cpp:20:53)>
  local_e8;
  GeneticAlgorithm *local_e0;
  Result *local_d8;
  long local_d0;
  __shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> local_b8;
  Individual local_a8;
  Individual father;
  Individual child;
  
  local_d8 = __return_storage_ptr__;
  lVar7 = std::chrono::_V2::system_clock::now();
  std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,&instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>);
  initializePopulation(this,(shared_ptr<Instance> *)&local_b8);
  local_d0 = lVar7 + 5000000000;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  local_e8._M_comp.instance = (anon_class_8_1_0902ba13)(anon_class_8_1_0902ba13)instance;
  local_e0 = this;
  while( true ) {
    lVar7 = std::chrono::_V2::system_clock::now();
    __comp._M_comp.instance = local_e8._M_comp.instance;
    if (local_d0 <= lVar7) {
      std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_c8,&instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>);
      pIVar10 = returnBestIndividual(this,(shared_ptr<Instance> *)&local_c8);
      Individual::Individual(&local_a8,pIVar10);
      pRVar5 = local_d8;
      Result::Result(local_d8,&local_a8);
      Individual::~Individual(&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
      return pRVar5;
    }
    peVar1 = (this->population).
             super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    __first._M_current =
         (peVar1->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (peVar1->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar8 = ((long)__last._M_current - (long)__first._M_current) / 0x28;
      lVar7 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::operator()(__first,__last,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,local_e8);
      if ((long)__last._M_current - (long)__first._M_current < 0x281) {
        std::operator()(__first,__last,__comp);
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        std::operator()(__first,__last_00,__comp);
        for (; __last_00._M_current != __last._M_current;
            __last_00._M_current = __last_00._M_current + 1) {
          std::operator()(__last_00,
                          (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Domomod[P]PCmax_SourceCode_Algorithms_GeneticAlgorithm_cpp:20:53)>
                           )local_e8._M_comp.instance);
        }
      }
    }
    std::make_shared<std::vector<Individual,std::allocator<Individual>>>();
    pGVar4 = local_e0;
    peVar1 = (local_e0->population).
             super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((ulong)(((long)(peVar1->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)(peVar1->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl.
                      super__Vector_impl_data._M_start) / 0x28) < 0x14) break;
    for (sVar11 = 0; sVar11 != 0x14; sVar11 = sVar11 + 1) {
      pvVar9 = std::vector<Individual,_std::allocator<Individual>_>::at
                         ((pGVar4->population).
                          super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,sVar11);
      std::vector<Individual,_std::allocator<Individual>_>::push_back(local_f8,pvVar9);
    }
    uVar8 = ((long)(local_f8->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(local_f8->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl.
                  super__Vector_impl_data._M_start) / 0x28;
    sVar11 = 0;
    if (0 < (int)uVar8) {
      sVar11 = uVar8 & 0xffffffff;
    }
    for (__n = 0; this = local_e0, instance = (shared_ptr<Instance> *)local_e8, __n != sVar11;
        __n = __n + 1) {
      pvVar9 = std::vector<Individual,_std::allocator<Individual>_>::at(local_f8,__n);
      Individual::Individual(&father,pvVar9);
      for (__n_00 = 0; (uVar8 & 0xffffffff) != __n_00; __n_00 = __n_00 + 1) {
        if (__n != __n_00) {
          pvVar9 = std::vector<Individual,_std::allocator<Individual>_>::at(local_f8,__n_00);
          Individual::makeOffspring(&child,&father,pvVar9);
          std::vector<Individual,_std::allocator<Individual>_>::push_back(local_f8,&child);
          Individual::~Individual(&child);
        }
      }
      Individual::~Individual(&father);
    }
    pIVar2 = (local_f8->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pIVar10 = (local_f8->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl.
                   super__Vector_impl_data._M_start; pIVar10 != pIVar2; pIVar10 = pIVar10 + 1) {
      Individual::Individual(&father,pIVar10);
      uVar6 = rand();
      if ((uVar6 & 1) == 0) {
        Individual::mutate(&father);
      }
      Individual::~Individual(&father);
    }
    peVar1 = (this->population).
             super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var3 = (this->population).
             super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->population).
    super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_f8;
    (this->population).
    super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Stack_f0._M_pi;
    _Stack_f0._M_pi = p_Var3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
    local_f8 = peVar1;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            (this_00,
             "Wanted to rewrite more individuals to next population that there is individuals",
             (allocator *)&father);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

Result GeneticAlgorithm::operator()(std::shared_ptr<Instance> instance) {
	auto start = high_resolution_clock::now();
	auto end = start + seconds(5);

	initializePopulation(instance);

	while(high_resolution_clock::now() < end){
		std::sort(population->begin(), population->end(), [&instance](Individual& a, Individual& b) { return a.valueFunction(instance) < b.valueFunction(instance); } );

		std::shared_ptr<std::vector<Individual>> newPopulation = std::make_shared<vector<Individual>>();
		int rewriteToNextPopulationCount = 20;
		
		if(rewriteToNextPopulationCount > population->size()) throw std::string("Wanted to rewrite more individuals to next population that there is individuals");

		for(int i = 0; i < rewriteToNextPopulationCount; i++){
			newPopulation->push_back(population->at(i));
		}

		int startingSize = newPopulation->size();
		for(int i = 0; i < startingSize; i++){
			Individual father = newPopulation->at(i);
			for(int j = 0; j < startingSize; j++){
				if(i != j){
					Individual& mother = newPopulation->at(j);
					Individual child = father.makeOffspring(mother);
					newPopulation->push_back(child);
				}
			}
		}

		for(Individual ind : *newPopulation){
			if(rand()%2 == 0)
				ind.mutate();
		}

		population.swap(newPopulation);
	}
	return (Result)returnBestIndividual(instance);
}